

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::run_impl(QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
           *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  ostream *i_ostream;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *pQVar1;
  ThreadData *thread;
  uint64_t uVar2;
  pointer pTVar3;
  pointer pPVar4;
  size_t i_target_put_count_00;
  pointer __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *extraout_RDX_02;
  void *__buf_00;
  void *__buf_01;
  uint64_t i_affinity_mask;
  pointer pTVar5;
  size_t thread_index_2;
  size_t i_target_count;
  size_t thread_index_1;
  size_t thread_index;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  pointer pPVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  FeedBack feedback;
  aligned_vector<ThreadData>_conflict52 threads;
  long spawned;
  FinalStats final_state;
  histogram<long,_true> histogram_spawned;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  queue;
  histogram<long,_true> histogram_except_puts;
  histogram<long,_true> histogram_except_cons;
  __atomic_base<bool> local_6a5;
  QueueTesterFlags local_6a4;
  EasyRandom *local_6a0;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *local_698;
  QueueTesterFlags local_68c;
  histogram<long,_true> *local_688;
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  local_680;
  size_t local_660;
  long local_658;
  _Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters>_>
  local_650;
  undefined1 local_628 [424];
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  local_480;
  histogram<long,_true> local_3b8;
  histogram<long,_true> local_218;
  
  lVar7 = *(long *)(this + 0x20);
  local_6a4 = i_flags;
  local_6a0 = i_random;
  local_68c = i_flags;
  if ((((*(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3 != lVar7) ||
       (*(long *)(this + 0x60) - *(long *)(this + 0x58) >> 3 != lVar7)) ||
      (*(long *)(this + 0x78) - *(long *)(this + 0x70) >> 3 != lVar7)) ||
     (*(long *)(this + 0x90) - *(long *)(this + 0x88) >> 3 != lVar7)) {
    detail::assert_failed<>
              ("m_put_cases.size() == case_count && m_consume_cases.size() == case_count && m_reentrant_put_cases.size() == case_count && m_reentrant_consume_cases.size() == case_count"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x75);
  }
  local_660 = i_target_put_count;
  density::detail::
  LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
  ::LFQueue_Head((LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::default_busy_wait>_>
                  *)&local_480);
  local_680.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_680.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_680.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a5._M_i = false;
  local_698 = (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
               *)this;
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ::reserve(&local_680,*(size_type *)(this + 0xa0));
  for (uVar6 = 0; uVar6 < local_698->m_thread_count; uVar6 = uVar6 + 1) {
    local_628._0_8_ = &local_6a5;
    std::
    vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::ThreadData>>
    ::
    emplace_back<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>const&,density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::FeedBack*,density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>&,density_tests::EasyRandom&,density_tests::QueueTesterFlags&>
              ((vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::ThreadData>>
                *)&local_680,local_698,(FeedBack **)local_628,&local_480,local_6a0,&local_6a4);
  }
  uVar2 = get_num_of_processors();
  i_target_count = local_660;
  pQVar1 = local_698;
  i_affinity_mask = 0xffffffffffffffff;
  if (1 < uVar2) {
    i_affinity_mask =
         (ulong)-(uint)(uVar2 < 4 || (local_6a4 & eReserveCoreToMainThread) == eNone) |
         0xfffffffffffffffd;
  }
  lVar7 = 0;
  for (uVar6 = 0; uVar8 = pQVar1->m_thread_count, uVar6 < uVar8; uVar6 = uVar6 + 1) {
    i_target_put_count_00 = i_target_count % uVar8 + i_target_count / uVar8;
    if (uVar6 != 0) {
      i_target_put_count_00 = i_target_count / uVar8;
    }
    ThreadData::start((ThreadData *)
                      ((long)((local_680.
                               super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_random).m_rand._M_x +
                      lVar7 + -0x50),uVar6,i_target_put_count_00,i_target_put_count_00,
                      i_affinity_mask);
    lVar7 = lVar7 + 0x1440;
  }
  LineUpdaterStreamAdapter::LineUpdaterStreamAdapter
            ((LineUpdaterStreamAdapter *)local_628,pQVar1->m_output);
  Progress::Progress((Progress *)&local_3b8,i_target_count);
  while( true ) {
    uVar6 = 0;
    uVar8 = 0;
    for (pTVar3 = local_680.
                  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar3 != local_680.
                  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
      uVar8 = uVar8 + (__int_type)
                      (((pTVar3->m_incremental_stats)._M_t.
                        super___uniq_ptr_impl<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        .
                        super__Head_base<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_false>
                       ._M_head_impl)->m_produced).super___atomic_base<unsigned_long>;
      uVar6 = uVar6 + (((pTVar3->m_incremental_stats)._M_t.
                        super___uniq_ptr_impl<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        .
                        super__Head_base<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_false>
                       ._M_head_impl)->m_consumed).super___atomic_base<unsigned_long>._M_i;
    }
    if ((i_target_count < uVar6) || (i_target_count < uVar8)) {
      detail::assert_failed<>
                ("consumed <= i_target_put_count && produced <= i_target_put_count",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0xd7);
    }
    local_688 = (histogram<long,_true> *)CONCAT71(local_688._1_7_,i_target_count <= uVar8);
    lVar7 = uVar8 - uVar6;
    if (uVar8 < uVar6 || lVar7 == 0) {
      local_6a5._M_i = false;
    }
    else {
      auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = 0x45300000;
      auVar11._8_4_ = (int)(uVar6 >> 0x20);
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = 0x45300000;
      local_6a5._M_i =
           0.2 < ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                 ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
    }
    i_ostream = (ostream *)(local_628 + 0x28);
    local_6a0._0_1_ = i_target_count <= uVar6;
    if ((local_6a4 & ePrintProgress) != eNone) {
      local_3b8._0_8_ = uVar6;
      std::operator<<(i_ostream,"Active threads: ");
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      std::operator<<(i_ostream,", Consumed: ");
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      std::operator<<(i_ostream," (");
      Progress::write_to_stream((Progress *)&local_3b8,i_ostream);
      std::operator<<(i_ostream,"), enqueued: ");
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      LineUpdaterStreamAdapter::end_line_impl((LineUpdaterStreamAdapter *)local_628);
    }
    local_6a0._0_1_ = (byte)local_6a0 & (byte)local_688;
    if ((byte)local_6a0 != 0) break;
    local_218.m_title = (ostringstream)0xc8;
    local_218._1_7_ = 0;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_218);
    i_target_count = local_660;
  }
  LineUpdaterStreamAdapter::~LineUpdaterStreamAdapter((LineUpdaterStreamAdapter *)local_628);
  pTVar3 = local_680.
           super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pQVar1 = local_698;
  for (pTVar5 = local_680.
                super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
                ._M_impl.super__Vector_impl_data._M_start; pTVar5 != pTVar3; pTVar5 = pTVar5 + 1) {
    std::thread::join();
  }
  histogram<long,_true>::histogram
            ((histogram<long,_true> *)local_628,"spawned by i-th thread",0x19,8);
  local_6a0 = (EasyRandom *)&local_3b8;
  histogram<long,_true>::histogram
            ((histogram<long,_true> *)local_6a0,"exceptions_during_puts",0x19,8);
  local_688 = &local_218;
  __n = (pointer)0x8;
  histogram<long,_true>::histogram(local_688,"exceptions_during_consumes",0x19,8);
  FinalStats::FinalStats
            ((FinalStats *)&local_650,
             (long)(pQVar1->m_put_cases).
                   super__Vector_base<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pQVar1->m_put_cases).
                   super__Vector_base<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_6a0 = (EasyRandom *)((long)local_6a0 + 0x178);
  local_688 = (histogram<long,_true> *)&local_688->m_values;
  __buf = extraout_RDX;
  for (uVar6 = 0;
      pTVar3 = local_680.
               super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
               ._M_impl.super__Vector_impl_data._M_start, pQVar1 = local_698,
      pPVar9 = local_650._M_impl.super__Vector_impl_data._M_start, uVar6 < local_698->m_thread_count
      ; uVar6 = uVar6 + 1) {
    pTVar5 = local_680.
             super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar6;
    FinalStats::operator+=((FinalStats *)&local_650,&pTVar5->m_final_stats);
    __n = pTVar3[uVar6].m_final_stats.m_counters.
          super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    local_658 = 0;
    for (pPVar4 = (pTVar5->m_final_stats).m_counters.
                  super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar4 != __n; pPVar4 = pPVar4 + 1) {
      local_658 = local_658 + pPVar4->m_spawned;
    }
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)(local_628 + 0x178),&local_658);
    __buf = extraout_RDX_00;
    if ((local_68c & eTestExceptions) != eNone) {
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_6a0,
                 &pTVar3[uVar6].m_final_stats.m_exceptions_during_puts);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_688,
                 &pTVar3[uVar6].m_final_stats.m_exceptions_during_consumes);
      __buf = extraout_RDX_01;
    }
  }
  for (; pPVar9 != local_650._M_impl.super__Vector_impl_data._M_finish; pPVar9 = pPVar9 + 1) {
    if (pPVar9->m_existing != 0) {
      detail::assert_failed<>
                ("counter.m_existing == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0x114);
      __buf = extraout_RDX_02;
    }
  }
  histogram<long,_true>::write
            ((histogram<long,_true> *)local_628,(int)pQVar1->m_output,__buf,(size_t)__n);
  if ((local_68c & eTestExceptions) != eNone) {
    histogram<long,_true>::write(&local_3b8,(int)pQVar1->m_output,__buf_00,(size_t)__n);
    histogram<long,_true>::write(&local_218,(int)pQVar1->m_output,__buf_01,(size_t)__n);
  }
  std::
  _Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::PutTypeCounters>_>
  ::~_Vector_base(&local_650);
  histogram<long,_true>::~histogram(&local_218);
  histogram<long,_true>::~histogram(&local_3b8);
  histogram<long,_true>::~histogram((histogram<long,_true> *)local_628);
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>_>
  ::~vector(&local_680);
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)&local_480);
  return;
}

Assistant:

void
          run_impl(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            auto const case_count = m_element_types.size();
            DENSITY_TEST_ASSERT(
              m_put_cases.size() == case_count && m_consume_cases.size() == case_count &&
              m_reentrant_put_cases.size() == case_count &&
              m_reentrant_consume_cases.size() == case_count);

            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            QUEUE queue;

            /* prepare the array of threads. The initialization of the random generator
                may take some time, so we do it before starting the threads. */
            aligned_vector<ThreadData> threads;
            FeedBack                   feedback;
            threads.reserve(m_thread_count);
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                threads.emplace_back(*this, &feedback, queue, i_random, i_flags);
            }

            uint64_t const num_of_processors = get_num_of_processors();
            bool const     reserve_core1_to_main =
              (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;

            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                uint64_t thread_affinity  = std::numeric_limits<uint64_t>::max();
                size_t   thread_put_count = 0, thread_consume_count = 0;

                if (reserve_core1_to_main)
                    thread_affinity -= 2;

                auto concurrent_puts     = QUEUE::concurrent_puts;
                auto concurrent_consumes = QUEUE::concurrent_consumes;

                if (concurrent_puts)
                {
                    // distribute the puts to the threads - the first thread gets the remainder
                    thread_put_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_put_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow puts only to the first thread, and reserve the first core to it
                    if (thread_index == 0)
                    {
                        thread_put_count = i_target_put_count;
                        thread_affinity  = 1;
                    }
                    else
                    {
                        thread_affinity ^= 1;
                    }
                }

                if (concurrent_consumes)
                {
                    // distribute the consumes to the threads - the first thread gets the remainder
                    thread_consume_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_consume_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow consumes only to the first thread, and reserve the last core to it
                    if (thread_index == m_thread_count - 1)
                    {
                        thread_consume_count = i_target_put_count;
                        thread_affinity      = uint64_t(1) << (num_of_processors - 1);
                    }
                    else
                    {
                        thread_affinity ^= uint64_t(1) << (num_of_processors - 1);
                    }
                }

                if (num_of_processors <= 1)
                    thread_affinity = std::numeric_limits<uint64_t>::max();

                threads[thread_index].start(
                  thread_index, thread_put_count, thread_consume_count, thread_affinity);
            }

            // wait for the test to be completed
            {
                LineUpdaterStreamAdapter line(m_output);
                bool                     complete = false;
                Progress                 progress(i_target_put_count);
                while (!complete)
                {
                    size_t produced = 0, consumed = 0;
                    size_t active_threads = 0;
                    for (auto & thread : threads)
                    {
                        produced += thread.incremental_stats().m_produced.load();
                        consumed += thread.incremental_stats().m_consumed.load();
                        active_threads +=
                          thread.incremental_stats().m_thread_is_active.load() ? 1 : 0;
                    }
                    DENSITY_TEST_ASSERT(
                      consumed <= i_target_put_count && produced <= i_target_put_count);
                    complete = consumed >= i_target_put_count && produced >= i_target_put_count;

                    bool too_many_enqueued = false;
                    if (produced > consumed)
                    {
                        double const enqueued_ratio =
                          static_cast<double>(produced - consumed) / static_cast<double>(consumed);
                        too_many_enqueued = enqueued_ratio > 0.2;
                    }
                    feedback.m_too_many_enqueued.store(
                      too_many_enqueued, std::memory_order_relaxed);

                    if (i_flags && QueueTesterFlags::ePrintProgress)
                    {
                        auto const enqueued = produced >= consumed ? (produced - consumed) : 0;
                        progress.set_progress(consumed);
                        line << "Active threads: " << active_threads << ", Consumed: " << consumed
                             << " (" << progress << "), enqueued: " << enqueued << std::endl;
                    }

                    if (!complete)
                    {
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    }
                }
            }

            for (auto & thread : threads)
            {
                thread.join();
            }

            histogram<int64_t> histogram_spawned("spawned by i-th thread");
            histogram<int64_t> histogram_except_puts("exceptions_during_puts");
            histogram<int64_t> histogram_except_cons("exceptions_during_consumes");

            FinalStats final_state(m_put_cases.size());
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                auto const & thread_state = threads[thread_index].final_stats();
                final_state += thread_state;

                auto const spawned = std::accumulate(
                  thread_state.m_counters.begin(),
                  thread_state.m_counters.end(),
                  static_cast<int64_t>(0),
                  [](int64_t i_sum, const PutTypeCounters & i_counter) {
                      return i_sum + i_counter.m_spawned;
                  });
                histogram_spawned << spawned;

                if (with_exceptions)
                {
                    histogram_except_puts << thread_state.m_exceptions_during_puts;
                    histogram_except_cons << thread_state.m_exceptions_during_consumes;
                }
            }

            for (auto const & counter : final_state.m_counters)
            {
                DENSITY_TEST_ASSERT(counter.m_existing == 0);
            }

            m_output << histogram_spawned;
            if (with_exceptions)
            {
                m_output << histogram_except_puts;
                m_output << histogram_except_cons;
            }
        }